

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *this,
          char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  pEVar1 = this->ptr;
  pEVar2 = this->pos;
  while (pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    pcVar3 = pEVar2[-1].value.content.ptr;
    if (pcVar3 != (char *)0x0) {
      sVar4 = pEVar2[-1].value.content.size_;
      pEVar2[-1].value.content.ptr = (char *)0x0;
      pEVar2[-1].value.content.size_ = 0;
      pAVar5 = pEVar2[-1].value.content.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
    }
    pEVar2 = this->pos;
  }
  return (int)pEVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }